

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchiveAsciiDump.h
# Opt level: O2

void __thiscall
chrono::ChArchiveAsciiDump::out(ChArchiveAsciiDump *this,ChNameValue<unsigned_int> *bVal)

{
  ChStreamOutAscii *this_00;
  
  indent(this);
  if (this->suppress_names == false) {
    this_00 = ChStreamOutAscii::operator<<(this->ostream,bVal->_name);
    ChStreamOutAscii::operator<<(this_00,"\t");
  }
  ChStreamOutAscii::operator<<(this->ostream,*bVal->_value);
  ChStreamOutAscii::operator<<(this->ostream,"\n");
  return;
}

Assistant:

virtual void out     (ChNameValue<unsigned int> bVal){
            indent();
            if (!suppress_names) 
                (*ostream) << bVal.name() << "\t";
            (*ostream) << bVal.value();
            (*ostream) << "\n";
      }